

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definition.cpp
# Opt level: O2

void __thiscall
slang::ast::Definition::Definition
          (Definition *this,Scope *scope,LookupLocation lookupLocation,
          ModuleDeclarationSyntax *syntax,NetType *defaultNetType,UnconnectedDrive unconnectedDrive,
          optional<slang::TimeScale> directiveTimeScale,SyntaxTree *syntaxTree)

{
  not_null<slang::syntax::ModuleHeaderSyntax_*> *this_00;
  pointer ppMVar1;
  SyntaxKind SVar2;
  ParameterPortListSyntax *syntax_00;
  MemberSyntax *this_01;
  size_type sVar3;
  Token token;
  _Storage<slang::ast::VariableLifetime,_true> _Var4;
  DefinitionKind DVar5;
  ModuleHeaderSyntax *pMVar6;
  SourceLocation SVar7;
  optional<slang::ast::VariableLifetime> oVar8;
  ModuleHeaderSyntax *pMVar9;
  TimeUnitsDeclarationSyntax *syntax_01;
  ParameterDeclarationStatementSyntax *pPVar10;
  ParameterDeclarationBaseSyntax *pPVar11;
  ModportDeclarationSyntax *pMVar12;
  ModportItemSyntax *pMVar13;
  pointer ppMVar14;
  bool bVar15;
  string_view sVar16;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar17;
  LookupLocation lookupLocation_00;
  not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> declaration;
  ulong local_80;
  string_view local_70;
  optional<slang::SourceRange> precisionRange;
  optional<slang::SourceRange> unitsRange;
  
  this->location = (SourceLocation)0x0;
  (this->name)._M_len = 0;
  (this->name)._M_str = (char *)0x0;
  this->syntax = syntax;
  this->defaultNetType = defaultNetType;
  this->scope = scope;
  this->unconnectedDrive = unconnectedDrive;
  (this->timeScale).base.unit = Seconds;
  (this->timeScale).base.magnitude = One;
  (this->timeScale).precision.unit = Seconds;
  (this->timeScale).precision.magnitude = One;
  (this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.data_ =
       (pointer)(this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.
                firstElement;
  (this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.len = 0;
  (this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.cap = 8;
  ska::detailv3::
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::sherwood_v3_table(&(this->modports).
                       super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     );
  (this->attributes).data_ = (pointer)0x0;
  (this->attributes).size_ = 0;
  this->syntaxTree = syntaxTree;
  this->instantiated = false;
  this_00 = &syntax->header;
  pMVar6 = not_null<slang::syntax::ModuleHeaderSyntax_*>::get(this_00);
  sVar16 = parsing::Token::valueText(&pMVar6->name);
  this->name = sVar16;
  SVar7 = parsing::Token::location(&pMVar6->name);
  this->location = SVar7;
  this->indexInScope = lookupLocation.index;
  DVar5 = SemanticFacts::getDefinitionKind((syntax->super_MemberSyntax).super_SyntaxNode.kind);
  this->definitionKind = DVar5;
  token.kind = (pMVar6->lifetime).kind;
  token._2_1_ = (pMVar6->lifetime).field_0x2;
  token.numFlags.raw = (pMVar6->lifetime).numFlags.raw;
  token.rawLen = (pMVar6->lifetime).rawLen;
  token.info = (pMVar6->lifetime).info;
  oVar8 = SemanticFacts::getVariableLifetime(token);
  _Var4._M_value = Static;
  if (((ulong)oVar8.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::VariableLifetime> >> 0x20 & 1) != 0) {
    _Var4._M_value =
         oVar8.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ast::VariableLifetime>._M_payload;
  }
  this->defaultLifetime = (VariableLifetime)_Var4;
  syntax_02 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
  lookupLocation_00._12_4_ = 0;
  lookupLocation_00.scope = (Scope *)SUB128(lookupLocation._0_12_,0);
  lookupLocation_00.index = SUB124(lookupLocation._0_12_,8);
  sVar17 = AttributeSymbol::fromSyntax(syntax_02,scope,lookupLocation_00);
  this->attributes = sVar17;
  pMVar9 = not_null<slang::syntax::ModuleHeaderSyntax_*>::get(this_00);
  if (pMVar9->ports == (PortListSyntax *)0x0) {
    bVar15 = false;
  }
  else {
    pMVar9 = not_null<slang::syntax::ModuleHeaderSyntax_*>::get(this_00);
    bVar15 = (pMVar9->ports->super_SyntaxNode).kind == NonAnsiPortList;
  }
  this->hasNonAnsiPorts = bVar15;
  syntax_00 = pMVar6->parameters;
  if (syntax_00 != (ParameterPortListSyntax *)0x0) {
    ParameterBuilder::createDecls
              (scope,syntax_00,
               &(this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>);
  }
  unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = false;
  precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = false;
  ppMVar14 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
             data_;
  ppMVar1 = ppMVar14 +
            (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            size_;
  bVar15 = true;
  do {
    if (ppMVar14 == ppMVar1) {
      SemanticFacts::populateTimeScale
                (&this->timeScale,scope,directiveTimeScale,
                 unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::SourceRange>._M_engaged,
                 precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::SourceRange>._M_engaged);
      return;
    }
    this_01 = *ppMVar14;
    SVar2 = (this_01->super_SyntaxNode).kind;
    if (SVar2 == ModportDeclaration) {
      pMVar12 = slang::syntax::SyntaxNode::as<slang::syntax::ModportDeclarationSyntax>
                          (&this_01->super_SyntaxNode);
      local_80 = 0;
      sVar3 = (pMVar12->items).elements.size_;
      declaration.ptr = (ParameterDeclarationBaseSyntax *)&pMVar12->items;
      for (; ((SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)declaration.ptr !=
              &pMVar12->items || (local_80 != sVar3 + 1 >> 1)); local_80 = local_80 + 1) {
        pMVar13 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::
                  iterator_base<slang::syntax::ModportItemSyntax_*>::operator*
                            ((iterator_base<slang::syntax::ModportItemSyntax_*> *)&declaration);
        local_70 = parsing::Token::valueText(&pMVar13->name);
        ska::detailv3::
        sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
        ::emplace<std::basic_string_view<char,std::char_traits<char>>>
                  ((sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
                    *)&this->modports,&local_70);
      }
LAB_0020ef26:
      bVar15 = false;
    }
    else {
      if (SVar2 == ParameterDeclarationStatement) {
        pPVar10 = slang::syntax::SyntaxNode::as<slang::syntax::ParameterDeclarationStatementSyntax>
                            (&this_01->super_SyntaxNode);
        not_null<slang::syntax::ParameterDeclarationBaseSyntax*>::
        not_null<slang::not_null<slang::syntax::ParameterDeclarationBaseSyntax*>&,void>
                  ((not_null<slang::syntax::ParameterDeclarationBaseSyntax*> *)&declaration,
                   &pPVar10->parameter);
        bVar15 = true;
        if (syntax_00 == (ParameterPortListSyntax *)0x0) {
          pPVar11 = not_null<slang::syntax::ParameterDeclarationBaseSyntax_*>::get(&declaration);
          bVar15 = (pPVar11->keyword).kind == LocalParamKeyword;
        }
        pPVar11 = not_null<slang::syntax::ParameterDeclarationBaseSyntax_*>::get(&declaration);
        ParameterBuilder::createDecls
                  (scope,pPVar11,bVar15,false,
                   &(this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>)
        ;
        goto LAB_0020ef26;
      }
      if (SVar2 != TimeUnitsDeclaration) goto LAB_0020ef26;
      syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::TimeUnitsDeclarationSyntax>
                            (&this_01->super_SyntaxNode);
      SemanticFacts::populateTimeScale
                (&this->timeScale,scope,syntax_01,&unitsRange,&precisionRange,bVar15);
    }
    ppMVar14 = ppMVar14 + 1;
  } while( true );
}

Assistant:

Definition::Definition(const Scope& scope, LookupLocation lookupLocation,
                       const ModuleDeclarationSyntax& syntax, const NetType& defaultNetType,
                       UnconnectedDrive unconnectedDrive,
                       std::optional<TimeScale> directiveTimeScale, const SyntaxTree* syntaxTree) :
    syntax(syntax),
    defaultNetType(defaultNetType), scope(scope), unconnectedDrive(unconnectedDrive),
    syntaxTree(syntaxTree) {

    // Extract and save various properties of the definition.
    auto& header = *syntax.header;
    name = header.name.valueText();
    location = header.name.location();
    indexInScope = lookupLocation.getIndex();
    definitionKind = SemanticFacts::getDefinitionKind(syntax.kind);
    defaultLifetime =
        SemanticFacts::getVariableLifetime(header.lifetime).value_or(VariableLifetime::Static);
    attributes = AttributeSymbol::fromSyntax(syntax.attributes, scope, lookupLocation);
    hasNonAnsiPorts = syntax.header->ports &&
                      syntax.header->ports->kind == SyntaxKind::NonAnsiPortList;

    // Find all port parameters.
    bool hasPortParams = header.parameters != nullptr;
    if (hasPortParams)
        ParameterBuilder::createDecls(scope, *header.parameters, parameters);

    bool first = true;
    std::optional<SourceRange> unitsRange;
    std::optional<SourceRange> precisionRange;

    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::TimeUnitsDeclaration) {
            SemanticFacts::populateTimeScale(timeScale, scope,
                                             member->as<TimeUnitsDeclarationSyntax>(), unitsRange,
                                             precisionRange, first);
            continue;
        }

        first = false;
        if (member->kind == SyntaxKind::ModportDeclaration) {
            for (auto item : member->as<ModportDeclarationSyntax>().items)
                modports.emplace(item->name.valueText());
        }
        else if (member->kind == SyntaxKind::ParameterDeclarationStatement) {
            auto declaration = member->as<ParameterDeclarationStatementSyntax>().parameter;
            bool isLocal = hasPortParams ||
                           declaration->keyword.kind == TokenKind::LocalParamKeyword;

            ParameterBuilder::createDecls(scope, *declaration, isLocal, /* isPort */ false,
                                          parameters);
        }
    }

    SemanticFacts::populateTimeScale(timeScale, scope, directiveTimeScale, unitsRange.has_value(),
                                     precisionRange.has_value());
}